

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

App * __thiscall CLI::App::needs(App *this,Option *opt)

{
  OptionNotFound *this_00;
  allocator local_39;
  string local_38;
  Option *local_18;
  Option *opt_local;
  App *this_local;
  
  local_18 = opt;
  opt_local = (Option *)this;
  if (opt == (Option *)0x0) {
    this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_38,"nullptr passed",&local_39);
    OptionNotFound::OptionNotFound(this_00,&local_38);
    __cxa_throw(this_00,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
  }
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::insert
            (&this->need_options_,&local_18);
  return this;
}

Assistant:

App *needs(Option *opt) {
        if(opt == nullptr) {
            throw OptionNotFound("nullptr passed");
        }
        need_options_.insert(opt);
        return this;
    }